

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

bool __thiscall Selector::callListeners(Selector *this,int fd,uint32_t events)

{
  byte bVar1;
  bool bVar2;
  ListenerNode **ppLVar3;
  iterator local_80;
  jh_ptr_int_t local_78;
  jh_ptr_int_t pd;
  SelectorListener *interface;
  iterator local_60;
  iterator listener;
  bool result;
  undefined1 local_48 [8];
  ListenerNode n;
  AutoLock l;
  uint32_t events_local;
  int fd_local;
  Selector *this_local;
  
  AutoLock::AutoLock((AutoLock *)&n.mPrivateData,&this->mLock);
  ListenerNode::ListenerNode((ListenerNode *)local_48,fd,(SelectorListener *)0x0);
  listener.mNode._3_1_ = 0;
  JetHead::list<Selector::ListenerNode_*>::begin
            ((list<Selector::ListenerNode_*> *)&stack0xffffffffffffffa0);
  while( true ) {
    JetHead::list<Selector::ListenerNode_*>::end((list<Selector::ListenerNode_*> *)&interface);
    bVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator!=
                      (&stack0xffffffffffffffa0,(iterator *)&interface);
    JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)&interface);
    bVar1 = listener.mNode._3_1_;
    if (!bVar2) break;
    ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*(&stack0xffffffffffffffa0)
    ;
    bVar2 = ListenerNode::operator==(*ppLVar3,(ListenerNode *)local_48);
    if (bVar2) {
      ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          (&stack0xffffffffffffffa0);
      pd = (jh_ptr_int_t)(*ppLVar3)->mListener;
      ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          (&stack0xffffffffffffffa0);
      local_78 = (*ppLVar3)->mPrivateData;
      if ((events & 0x30) == 0) {
        JetHead::list<Selector::ListenerNode_*>::iterator::operator++(&stack0xffffffffffffffa0);
      }
      else {
        if ((events & 0x20) != 0) {
          ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                              (&stack0xffffffffffffffa0);
          jh_log_print(2,"bool Selector::callListeners(int, uint32_t)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                       ,0x18a,"POLLNVAL recieved on fd = %d (%p)",(ulong)(uint)fd,*ppLVar3);
        }
        ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                            (&stack0xffffffffffffffa0);
        if (*ppLVar3 != (ListenerNode *)0x0) {
          operator_delete(*ppLVar3,0x18);
        }
        JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_80);
        local_60.mNode = local_80.mNode;
        JetHead::list<Selector::ListenerNode_*>::iterator::~iterator(&local_80);
        listener.mNode._3_1_ = 1;
      }
      if (pd != 0) {
        l.mLine._0_2_ = (short)events;
        (*(code *)**(undefined8 **)pd)(pd,fd,(int)(short)l.mLine,local_78);
      }
    }
    else {
      JetHead::list<Selector::ListenerNode_*>::iterator::operator++(&stack0xffffffffffffffa0);
    }
  }
  JetHead::list<Selector::ListenerNode_*>::iterator::~iterator(&stack0xffffffffffffffa0);
  AutoLock::~AutoLock((AutoLock *)&n.mPrivateData);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Selector::callListeners( int fd, uint32_t events )
{
	AutoLock l( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );
	ListenerNode n( fd, NULL );
	bool result = false;
	
	JetHead::list<ListenerNode*>::iterator listener = mList.begin();
	while (listener != mList.end())
	{
		if (*(*listener) == n)
		{
			LOG( "got event %x %p", events, *listener );
		
			// We want to remove the listener from the list if 
			//  revents includes POLLHUP or POLLNVAL.  But we also
			//  need for the listener to know about these event(s).
			// A "good" listener could take care of this by 
			//  removing himself from the selector.  The lock has 
			//  been made recursive so this is possible without dead
			//  locking.  But a "bad" listener may ignore these 
			//  event entirly.  
			// So in the spirit of "doing the right thing".  We need
			//  to deal with both cases.  However once we 
			//  call the listener's callback, the listener itself
			//  might be destroyed.  But if POLLHUP or POLLNVAL
			//  was recieved and the listener has not been destroyed
			//  we must do it.
			
			// listener might be destroyed if POLLHUP or POLLNVAL
			//  events are recieved.  So we will get any data we 
			//  need from it now. 
			SelectorListener *interface = (*listener)->mListener;
			jh_ptr_int_t pd = (*listener)->mPrivateData;
		
			if ( events & ( POLLHUP | POLLNVAL ) )
			{	
				if ( events & POLLHUP )
					LOG_INFO( "POLLHUP recieved on fd = %d (%p)", fd, *listener );
				
				if ( events & POLLNVAL )
					LOG_WARN( "POLLNVAL recieved on fd = %d (%p)", fd, *listener );
								
				delete *listener;
				listener = listener.erase();

				result = true;
			}
			else
			{
				// Gets incremented by the "erase" in the other branch
				++listener;
			}
			
			if ( interface != NULL )
			{
				LOG_NOISE( "eventsCallback %p %d %d", interface, events, fd );
				interface->processFileEvents( fd, events, pd );
				LOG_NOISE( "eventsCallback done" );
			}
		} else {
			++listener;
		}
	}
	
	return result;
}